

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O2

bool spvtools::opt::analysis::CompareAndPrintDifferences(DefUseManager *lhs,DefUseManager *rhs)

{
  bool bVar1;
  bool bVar2;
  const_iterator cVar3;
  size_type sVar4;
  _Rb_tree_node_base *p_Var5;
  size_type sVar6;
  IdToDefMap *__range3_1;
  __node_base *p_Var7;
  __node_base *p_Var8;
  IdToDefMap *__range3;
  IdToUsersMap *__range3_2;
  value_type p;
  pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  
  bVar1 = std::operator!=(&lhs->id_to_def_,&rhs->id_to_def_);
  if (bVar1) {
    p_Var8 = &(lhs->id_to_def_)._M_h._M_before_begin;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      local_58.first = *(Instruction **)(p_Var8 + 1);
      local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor;
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)rhs,(key_type_conflict *)&local_58);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        puts("Diff in id_to_def: missing value in rhs");
      }
    }
    p_Var8 = &(rhs->id_to_def_)._M_h._M_before_begin;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      local_58.first = *(Instruction **)(p_Var8 + 1);
      local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)&((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor;
      cVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)lhs,(key_type_conflict *)&local_58);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        puts("Diff in id_to_def: missing value in lhs");
      }
    }
  }
  bVar2 = std::operator!=(&lhs->id_to_users_,&rhs->id_to_users_);
  if (bVar2) {
    for (p_Var5 = (lhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(lhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      local_58.first = *(Instruction **)(p_Var5 + 1);
      local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = &(p_Var5[1]._M_parent)->_M_color;
      sVar4 = std::
              set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
              ::count(&rhs->id_to_users_,(key_type *)&local_58);
      if (sVar4 == 0) {
        puts("Diff in id_to_users: missing value in rhs");
      }
    }
    for (p_Var5 = (rhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(rhs->id_to_users_)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      local_58.first = *(Instruction **)(p_Var5 + 1);
      local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = &(p_Var5[1]._M_parent)->_M_color;
      sVar4 = std::
              set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
              ::count(&lhs->id_to_users_,(key_type *)&local_58);
      if (sVar4 == 0) {
        puts("Diff in id_to_users: missing value in lhs");
      }
    }
    bVar1 = false;
  }
  else {
    bVar1 = !bVar1;
  }
  bVar2 = std::operator!=(&lhs->inst_to_used_ids_,&rhs->inst_to_used_ids_);
  if (bVar2) {
    p_Var7 = &(lhs->inst_to_used_ids_)._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      std::
      pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::pair(&local_58,
             (pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)(p_Var7 + 1));
      sVar6 = std::
              _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&(rhs->inst_to_used_ids_)._M_h,&local_58.first);
      if (sVar6 == 0) {
        puts("Diff in inst_to_used_ids: missing value in rhs");
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    p_Var7 = &(rhs->inst_to_used_ids_)._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      std::
      pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::pair(&local_58,
             (pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)(p_Var7 + 1));
      sVar6 = std::
              _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&(lhs->inst_to_used_ids_)._M_h,&local_58.first);
      if (sVar6 == 0) {
        puts("Diff in inst_to_used_ids: missing value in lhs");
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CompareAndPrintDifferences(const DefUseManager& lhs,
                                const DefUseManager& rhs) {
  bool same = true;

  if (lhs.id_to_def_ != rhs.id_to_def_) {
    for (auto p : lhs.id_to_def_) {
      if (rhs.id_to_def_.find(p.first) == rhs.id_to_def_.end()) {
        printf("Diff in id_to_def: missing value in rhs\n");
      }
    }
    for (auto p : rhs.id_to_def_) {
      if (lhs.id_to_def_.find(p.first) == lhs.id_to_def_.end()) {
        printf("Diff in id_to_def: missing value in lhs\n");
      }
    }
    same = false;
  }

  if (lhs.id_to_users_ != rhs.id_to_users_) {
    for (auto p : lhs.id_to_users_) {
      if (rhs.id_to_users_.count(p) == 0) {
        printf("Diff in id_to_users: missing value in rhs\n");
      }
    }
    for (auto p : rhs.id_to_users_) {
      if (lhs.id_to_users_.count(p) == 0) {
        printf("Diff in id_to_users: missing value in lhs\n");
      }
    }
    same = false;
  }

  if (lhs.inst_to_used_ids_ != rhs.inst_to_used_ids_) {
    for (auto p : lhs.inst_to_used_ids_) {
      if (rhs.inst_to_used_ids_.count(p.first) == 0) {
        printf("Diff in inst_to_used_ids: missing value in rhs\n");
      }
    }
    for (auto p : rhs.inst_to_used_ids_) {
      if (lhs.inst_to_used_ids_.count(p.first) == 0) {
        printf("Diff in inst_to_used_ids: missing value in lhs\n");
      }
    }
    same = false;
  }

  return same;
}